

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void __thiscall
SQLexer::Init(SQLexer *this,SQSharedState *ss,SQLEXREADFUNC rg,SQUserPointer up,
             CompilerErrorFunc efunc,void *ed)

{
  SQTable *pSVar1;
  SQString *pSVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  SQInteger in_stack_fffffffffffff9c8;
  SQSharedState *in_stack_fffffffffffff9d0;
  SQLexer *this_00;
  SQChar *in_stack_fffffffffffff9d8;
  SQChar *s;
  SQSharedState *in_stack_fffffffffffff9e0;
  SQSharedState *ss_00;
  SQObjectPtr *in_stack_fffffffffffff9f8;
  SQObjectPtr *val;
  SQObjectPtr *in_stack_fffffffffffffa00;
  SQObjectPtr *key;
  SQTable *in_stack_fffffffffffffa08;
  SQObjectPtr local_500;
  SQObjectPtr local_4f0;
  SQObjectPtr local_4e0;
  SQObjectPtr local_4d0;
  SQObjectPtr local_4c0;
  SQObjectPtr local_4b0;
  SQObjectPtr local_4a0;
  SQObjectPtr local_490;
  SQObjectPtr local_480;
  SQObjectPtr local_470;
  SQObjectPtr local_460;
  SQObjectPtr local_450;
  SQObjectPtr local_440;
  SQObjectPtr local_430;
  SQObjectPtr local_420;
  SQObjectPtr local_410;
  SQObjectPtr local_400;
  SQObjectPtr local_3f0;
  SQObjectPtr local_3e0;
  SQObjectPtr local_3d0;
  SQObjectPtr local_3c0;
  SQObjectPtr local_3b0;
  SQObjectPtr local_3a0;
  SQObjectPtr local_390;
  SQObjectPtr local_380;
  SQObjectPtr local_370;
  SQObjectPtr local_360;
  SQObjectPtr local_350;
  SQObjectPtr local_340;
  SQObjectPtr local_330;
  SQObjectPtr local_320;
  SQObjectPtr local_310;
  SQObjectPtr local_300;
  SQObjectPtr local_2f0;
  SQObjectPtr local_2e0;
  SQObjectPtr local_2d0;
  SQObjectPtr local_2c0;
  SQObjectPtr local_2b0;
  SQObjectPtr local_2a0;
  SQObjectPtr local_290;
  SQObjectPtr local_280;
  SQObjectPtr local_270;
  SQObjectPtr local_260;
  SQObjectPtr local_250;
  SQObjectPtr local_240;
  SQObjectPtr local_230;
  SQObjectPtr local_220;
  SQObjectPtr local_210;
  SQObjectPtr local_200;
  SQObjectPtr local_1f0;
  SQObjectPtr local_1e0;
  SQObjectPtr local_1d0;
  SQObjectPtr local_1c0;
  SQObjectPtr local_1b0;
  SQObjectPtr local_1a0;
  SQObjectPtr local_190;
  SQObjectPtr local_180;
  SQObjectPtr local_170;
  SQObjectPtr local_160;
  SQObjectPtr local_150;
  SQObjectPtr local_140;
  SQObjectPtr local_130;
  SQObjectPtr local_120;
  SQObjectPtr local_110;
  SQObjectPtr local_100;
  SQObjectPtr local_f0;
  SQObjectPtr local_e0;
  SQObjectPtr local_d0;
  SQObjectPtr local_c0;
  SQObjectPtr local_b0;
  SQObjectPtr local_a0;
  SQObjectPtr local_90;
  SQObjectPtr local_80;
  SQObjectPtr local_70 [2];
  SQObjectPtr local_50;
  SQObjectPtr local_40 [2];
  undefined8 local_20;
  undefined8 local_18;
  
  *(undefined8 *)(in_RDI + 0x88) = in_R8;
  *(undefined8 *)(in_RDI + 0x90) = in_R9;
  *(undefined8 *)(in_RDI + 0x68) = in_RSI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  pSVar1 = SQTable::Create(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  *(SQTable **)(in_RDI + 8) = pSVar1;
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(local_40,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_50,0x112);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(local_70,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_80,0x115);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_90,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_a0,0x110);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_b0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_c0,0x111);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_d0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_e0,0x113);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_f0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_100,0x123);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_110,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_120,0x11e);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_130,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_140,0x116);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_150,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_160,0x11d);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_170,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_180,0x11b);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_190,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1a0,0x114);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_1b0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1c0,0x117);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_1d0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1e0,0x118);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_1f0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_200,0x11f);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_210,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_220,0x106);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_230,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_240,0x107);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_250,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_260,0x125);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_270,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_280,0x126);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_290,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2a0,0x127);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_2b0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2c0,0x11c);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_2d0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2e0,0x124);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_2f0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_300,0x12a);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_310,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_320,0x10c);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_330,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_340,300);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_350,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_360,0x12d);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_370,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_380,0x12e);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_390,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3a0,0x133);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_3b0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3c0,0x134);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_3d0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3e0,0x136);
  SQTable::NewSlot(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar1 = *(SQTable **)(in_RDI + 8);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_3f0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_400,0x137);
  SQTable::NewSlot(pSVar1,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  key = *(SQObjectPtr **)(in_RDI + 8);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_410,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_420,0x13b);
  SQTable::NewSlot(pSVar1,key,in_stack_fffffffffffff9f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  val = *(SQObjectPtr **)(in_RDI + 8);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_430,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_440,0x13c);
  SQTable::NewSlot(pSVar1,key,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_450,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_460,0x142);
  SQTable::NewSlot(pSVar1,key,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            (SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_470,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_480,0x143);
  SQTable::NewSlot(pSVar1,key,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ss_00 = *(SQSharedState **)(in_RDI + 8);
  pSVar2 = SQString::Create(ss_00,in_stack_fffffffffffff9d8,(SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_490,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4a0,0x144);
  SQTable::NewSlot(pSVar1,key,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  s = *(SQChar **)(in_RDI + 8);
  pSVar2 = SQString::Create(ss_00,s,(SQInteger)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::SQObjectPtr(&local_4b0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4c0,0x139);
  SQTable::NewSlot(pSVar1,key,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9d0);
  this_00 = *(SQLexer **)(in_RDI + 8);
  pSVar2 = SQString::Create(ss_00,s,(SQInteger)this_00);
  ::SQObjectPtr::SQObjectPtr(&local_4d0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4e0,0x13a);
  SQTable::NewSlot(pSVar1,key,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  pSVar2 = SQString::Create(ss_00,s,(SQInteger)this_00);
  ::SQObjectPtr::SQObjectPtr(&local_4f0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_500,0x145);
  SQTable::NewSlot(pSVar1,key,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  *(undefined8 *)(in_RDI + 0x50) = local_18;
  *(undefined8 *)(in_RDI + 0x58) = local_20;
  *(undefined8 *)(in_RDI + 0x20) = 1;
  *(undefined8 *)(in_RDI + 0x28) = 1;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  Next(this_00);
  return;
}

Assistant:

void SQLexer::Init(SQSharedState *ss, SQLEXREADFUNC rg, SQUserPointer up,CompilerErrorFunc efunc,void *ed)
{
    _errfunc = efunc;
    _errtarget = ed;
    _sharedstate = ss;
    _keywords = SQTable::Create(ss, 37);
    ADD_KEYWORD(while, TK_WHILE);
    ADD_KEYWORD(do, TK_DO);
    ADD_KEYWORD(if, TK_IF);
    ADD_KEYWORD(else, TK_ELSE);
    ADD_KEYWORD(break, TK_BREAK);
    ADD_KEYWORD(continue, TK_CONTINUE);
    ADD_KEYWORD(return, TK_RETURN);
    ADD_KEYWORD(null, TK_NULL);
    ADD_KEYWORD(function, TK_FUNCTION);
    ADD_KEYWORD(local, TK_LOCAL);
    ADD_KEYWORD(for, TK_FOR);
    ADD_KEYWORD(foreach, TK_FOREACH);
    ADD_KEYWORD(in, TK_IN);
    ADD_KEYWORD(typeof, TK_TYPEOF);
    ADD_KEYWORD(base, TK_BASE);
    ADD_KEYWORD(delete, TK_DELETE);
    ADD_KEYWORD(try, TK_TRY);
    ADD_KEYWORD(catch, TK_CATCH);
    ADD_KEYWORD(throw, TK_THROW);
    ADD_KEYWORD(clone, TK_CLONE);
    ADD_KEYWORD(yield, TK_YIELD);
    ADD_KEYWORD(resume, TK_RESUME);
    ADD_KEYWORD(switch, TK_SWITCH);
    ADD_KEYWORD(case, TK_CASE);
    ADD_KEYWORD(default, TK_DEFAULT);
    ADD_KEYWORD(this, TK_THIS);
    ADD_KEYWORD(class,TK_CLASS);
    ADD_KEYWORD(extends,TK_EXTENDS);
    ADD_KEYWORD(constructor,TK_CONSTRUCTOR);
    ADD_KEYWORD(instanceof,TK_INSTANCEOF);
    ADD_KEYWORD(true,TK_TRUE);
    ADD_KEYWORD(false,TK_FALSE);
    ADD_KEYWORD(static,TK_STATIC);
    ADD_KEYWORD(enum,TK_ENUM);
    ADD_KEYWORD(const,TK_CONST);
    ADD_KEYWORD(__LINE__,TK___LINE__);
    ADD_KEYWORD(__FILE__,TK___FILE__);
    ADD_KEYWORD(rawcall, TK_RAWCALL);


    _readf = rg;
    _up = up;
    _lasttokenline = _currentline = 1;
    _currentcolumn = 0;
    _prevtoken = -1;
    _reached_eof = SQFalse;
    Next();
}